

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int xferOptimization(Parse *pParse,Table *pDest,Select *pSelect,int onError,int iDbDest)

{
  u8 uVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  sqlite3 *psVar5;
  SrcList *pSVar6;
  Column *pCVar7;
  Column *pCVar8;
  long lVar9;
  long lVar10;
  Schema *pSVar11;
  bool bVar12;
  char cVar13;
  int iVar14;
  int iCur;
  int iVar15;
  int iVar16;
  Trigger *pTVar17;
  Table *pTab;
  Vdbe *p;
  int iVar18;
  Schema **ppSVar19;
  Op *pOVar20;
  Index *pSrc;
  u16 uVar21;
  long lVar22;
  Index *pIVar23;
  Index *local_78;
  ulong local_70;
  int local_60;
  int local_5c;
  int local_50;
  int local_48;
  int local_44;
  
  if (pSelect == (Select *)0x0) {
    return 0;
  }
  if (pParse->pWith != (With *)0x0) {
    return 0;
  }
  if (pSelect->pWith != (With *)0x0) {
    return 0;
  }
  psVar5 = pParse->db;
  pTVar17 = sqlite3TriggerList((Parse *)psVar5->aDb[1].pSchema,
                               (Table *)(ulong)pParse->disableTriggers);
  if (pTVar17 != (Trigger *)0x0) {
    return 0;
  }
  if (pDest->nModuleArg != 0) {
    return 0;
  }
  if (onError == 0xb) {
    if ((pDest->iPKey < 0) || (pDest->keyConf == 0xb)) {
      onError = 2;
    }
    else {
      onError = (int)pDest->keyConf;
    }
  }
  pSVar6 = pSelect->pSrc;
  if (pSVar6->nSrc != 1) {
    return 0;
  }
  if (pSVar6->a[0].pSelect != (Select *)0x0) {
    return 0;
  }
  if (pSelect->pWhere != (Expr *)0x0) {
    return 0;
  }
  if (pSelect->pOrderBy != (ExprList *)0x0) {
    return 0;
  }
  if (pSelect->pGroupBy != (ExprList *)0x0) {
    return 0;
  }
  if (pSelect->pLimit != (Expr *)0x0) {
    return 0;
  }
  if (pSelect->pPrior != (Select *)0x0) {
    return 0;
  }
  if ((pSelect->selFlags & 1) != 0) {
    return 0;
  }
  if (pSelect->pEList->nExpr != 1) {
    return 0;
  }
  if ((pSelect->pEList->a[0].pExpr)->op != 0xac) {
    return 0;
  }
  pTab = sqlite3LocateTableItem(pParse,0,pSVar6->a);
  if (pTab == (Table *)0x0) {
    return 0;
  }
  if ((pTab->tnum == pDest->tnum) && (pTab->pSchema == pDest->pSchema)) {
    return 0;
  }
  if (((pTab->tabFlags ^ pDest->tabFlags) & 0x20) != 0) {
    return 0;
  }
  if (pTab->nModuleArg != 0) {
    return 0;
  }
  if (pTab->pSelect != (Select *)0x0) {
    return 0;
  }
  uVar4 = pDest->nCol;
  if (uVar4 != pTab->nCol) {
    return 0;
  }
  if (pDest->iPKey != pTab->iPKey) {
    return 0;
  }
  if (0 < (short)uVar4) {
    pCVar7 = pDest->aCol;
    pCVar8 = pTab->aCol;
    lVar22 = 0;
    do {
      if ((&pCVar7->affinity)[lVar22] != (&pCVar8->affinity)[lVar22]) {
        return 0;
      }
      iVar14 = sqlite3_stricmp(*(char **)((long)&pCVar7->zColl + lVar22),
                               *(char **)((long)&pCVar8->zColl + lVar22));
      if (iVar14 != 0) {
        return 0;
      }
      if (((&pCVar7->notNull)[lVar22] != '\0') && ((&pCVar8->notNull)[lVar22] == '\0')) {
        return 0;
      }
      if (lVar22 != 0) {
        lVar9 = *(long *)((long)&pCVar7->pDflt + lVar22);
        lVar10 = *(long *)((long)&pCVar8->pDflt + lVar22);
        if ((lVar9 == 0) == (lVar10 != 0)) {
          return 0;
        }
        if ((lVar9 != 0) &&
           (iVar14 = strcmp(*(char **)(lVar9 + 8),*(char **)(lVar10 + 8)), iVar14 != 0)) {
          return 0;
        }
      }
      lVar22 = lVar22 + 0x20;
    } while ((ulong)uVar4 << 5 != lVar22);
  }
  local_78 = pDest->pIndex;
  if (local_78 == (Index *)0x0) {
    bVar12 = false;
  }
  else {
    bVar12 = false;
    do {
      if (local_78->onError != '\0') {
        bVar12 = true;
      }
      pIVar23 = pTab->pIndex;
      while( true ) {
        if (pIVar23 == (Index *)0x0) {
          return 0;
        }
        iVar14 = xferCompatibleIndex(local_78,pIVar23);
        if (iVar14 != 0) break;
        pIVar23 = pIVar23->pNext;
      }
      if ((pIVar23->tnum == local_78->tnum) && (pTab->pSchema == pDest->pSchema)) {
        if (sqlite3Config.xTestCallback == (_func_int_int *)0x0) {
          return 0;
        }
        iVar14 = (*sqlite3Config.xTestCallback)(0x19b);
        if (iVar14 == 0) {
          return 0;
        }
      }
      local_78 = local_78->pNext;
    } while (local_78 != (Index *)0x0);
  }
  if ((pDest->pCheck != (ExprList *)0x0) &&
     (iVar14 = sqlite3ExprListCompare(pTab->pCheck,pDest->pCheck,-1), iVar14 != 0)) {
    return 0;
  }
  cVar13 = (char)psVar5->flags;
  if (((uint)psVar5->flags >> 0xe & 1) == 0) {
    if (cVar13 < '\0') {
      return 0;
    }
  }
  else {
    if (cVar13 < '\0') {
      return 0;
    }
    if (pDest->pFKey != (FKey *)0x0) {
      return 0;
    }
  }
  if (pTab->pSchema == (Schema *)0x0) {
    local_50 = -1000000;
  }
  else {
    local_50 = -1;
    ppSVar19 = &psVar5->aDb->pSchema;
    do {
      local_50 = local_50 + 1;
      pSVar11 = *ppSVar19;
      ppSVar19 = ppSVar19 + 4;
    } while (pSVar11 != pTab->pSchema);
  }
  p = sqlite3GetVdbe(pParse);
  sqlite3CodeVerifySchema(pParse,local_50);
  iVar14 = pParse->nTab;
  iCur = iVar14 + 1;
  pParse->nTab = iVar14 + 2;
  iVar15 = autoIncBegin(pParse,iDbDest,pDest);
  uVar1 = pParse->nTempReg;
  if (uVar1 == '\0') {
    local_5c = pParse->nMem + 1;
    pParse->nMem = local_5c;
  }
  else {
    bVar2 = uVar1 - 1;
    pParse->nTempReg = bVar2;
    local_5c = pParse->aTempReg[bVar2];
    if (bVar2 != 0) {
      pParse->nTempReg = uVar1 - 2;
      local_60 = pParse->aTempReg[(byte)(uVar1 - 2)];
      goto LAB_001b91bb;
    }
  }
  local_60 = pParse->nMem + 1;
  pParse->nMem = local_60;
LAB_001b91bb:
  sqlite3OpenTable(pParse,iCur,iDbDest,pDest,0x6d);
  local_44 = 0;
  if (((psVar5->mDbFlags & 4) == 0) &&
     ((((pDest->iPKey < 0 && (pDest->pIndex != (Index *)0x0)) || (bVar12)) ||
      (onError - 3U < 0xfffffffe)))) {
    iVar16 = sqlite3VdbeAddOp3(p,0x24,iCur,0,0);
    local_44 = sqlite3VdbeAddOp3(p,0xb,0,0,0);
    if (p->db->mallocFailed == '\0') {
      iVar18 = p->nOp + -1;
      if (-1 < iVar16) {
        iVar18 = iVar16;
      }
      pOVar20 = p->aOp + iVar18;
    }
    else {
      pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar20->p2 = p->nOp;
  }
  if ((pTab->tabFlags & 0x20) == 0) {
    sqlite3OpenTable(pParse,iVar14,local_50,pTab,0x6c);
    local_48 = sqlite3VdbeAddOp3(p,0x24,iVar14,0,0);
    if (pDest->iPKey < 0) {
      if ((pDest->pIndex == (Index *)0x0) && ((psVar5->mDbFlags & 8) == 0)) {
        iVar16 = 0x79;
        iVar15 = iCur;
      }
      else {
        iVar16 = 0x80;
        iVar15 = iVar14;
      }
      local_70._0_4_ = sqlite3VdbeAddOp3(p,iVar16,iVar15,local_60,0);
    }
    else {
      local_70._0_4_ = sqlite3VdbeAddOp3(p,0x80,iVar14,local_60,0);
      iVar16 = sqlite3VdbeAddOp3(p,0x1f,iCur,0,local_60);
      sqlite3RowidConstraint(pParse,onError,pDest);
      if (p->db->mallocFailed == '\0') {
        iVar18 = p->nOp + -1;
        if (-1 < iVar16) {
          iVar18 = iVar16;
        }
        pOVar20 = p->aOp + iVar18;
      }
      else {
        pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar20->p2 = p->nOp;
      if (0 < iVar15) {
        sqlite3VdbeAddOp3(pParse->pVdbe,0x97,iVar15,local_60,0);
      }
    }
    sqlite3VdbeAddOp3(p,0x7f,iVar14,local_5c,1);
    uVar21 = 0x29;
    if ((psVar5->mDbFlags & 4) != 0) {
      sqlite3VdbeAddOp3(p,0x82,iCur,0,0);
      uVar21 = 0x39;
    }
    iVar15 = sqlite3VdbeAddOp3(p,0x7a,iCur,local_5c,local_60);
    sqlite3VdbeChangeP4(p,iVar15,(char *)pDest,-6);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = uVar21;
    }
    sqlite3VdbeAddOp3(p,5,iVar14,(uint)local_70,0);
    sqlite3VdbeAddOp3(p,0x75,iVar14,0,0);
    sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
  }
  else {
    sqlite3TableLock(pParse,iDbDest,pDest->tnum,'\x01',pDest->zName);
    local_48 = 0;
    sqlite3TableLock(pParse,local_50,pTab->tnum,'\0',pTab->zName);
  }
  pIVar23 = pDest->pIndex;
  do {
    if (pIVar23 == (Index *)0x0) {
      if (local_48 != 0) {
        if (p->db->mallocFailed == '\0') {
          iVar14 = p->nOp + -1;
          if (-1 < local_48) {
            iVar14 = local_48;
          }
          pOVar20 = p->aOp + iVar14;
        }
        else {
          pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar20->p2 = p->nOp;
      }
      if (local_60 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = local_60;
        }
      }
      if (local_5c != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = local_5c;
        }
      }
      if (local_44 == 0) {
        iVar14 = 1;
      }
      else {
        if (pParse->pAinc != (AutoincInfo *)0x0) {
          autoIncrementEnd(pParse);
        }
        iVar14 = 0;
        sqlite3VdbeAddOp3(p,0x45,0,0,0);
        if (p->db->mallocFailed == '\0') {
          iVar15 = p->nOp + -1;
          if (-1 < local_44) {
            iVar15 = local_44;
          }
          pOVar20 = p->aOp + iVar15;
        }
        else {
          pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar20->p2 = p->nOp;
        sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
      }
      return iVar14;
    }
    for (pSrc = pTab->pIndex; pSrc != (Index *)0x0; pSrc = pSrc->pNext) {
      iVar15 = xferCompatibleIndex(pIVar23,pSrc);
      if (iVar15 != 0) goto LAB_001b9507;
    }
    pSrc = (Index *)0x0;
LAB_001b9507:
    sqlite3VdbeAddOp3(p,0x6c,iVar14,pSrc->tnum,local_50);
    sqlite3VdbeSetP4KeyInfo(pParse,pSrc);
    sqlite3VdbeAddOp3(p,0x6d,iCur,pIVar23->tnum,iDbDest);
    sqlite3VdbeSetP4KeyInfo(pParse,pIVar23);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 1;
    }
    local_70 = 0;
    iVar15 = sqlite3VdbeAddOp3(p,0x24,iVar14,0,0);
    sqlite3VdbeAddOp3(p,0x7f,iVar14,local_5c,1);
    if ((psVar5->mDbFlags & 4) != 0) {
      uVar4 = pSrc->nColumn;
      if (uVar4 != 0) {
        local_70 = 0;
LAB_001b95e5:
        if (pSrc->azColl[local_70] != (char *)0x0) {
          lVar22 = 0;
          do {
            bVar2 = "BINARY"[lVar22];
            bVar3 = pSrc->azColl[local_70][lVar22];
            if (bVar2 == bVar3) {
              if ((ulong)bVar2 == 0) goto LAB_001b9628;
            }
            else if (""[bVar2] != ""[bVar3]) break;
            lVar22 = lVar22 + 1;
          } while( true );
        }
      }
      if ((uint)local_70 == uVar4) {
LAB_001b9642:
        sqlite3VdbeAddOp3(p,0x82,iCur,0,0);
        local_70 = 0x10;
      }
      else {
        local_70 = 0;
      }
    }
    if ((pTab->tabFlags & 0x20) != 0) {
      local_70._0_1_ = (byte)local_70 | (*(ushort *)&pIVar23->field_0x63 & 3) == 2;
    }
    sqlite3VdbeAddOp3(p,0x84,iCur,local_5c,0);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = (ushort)((byte)local_70 | 8);
    }
    sqlite3VdbeAddOp3(p,5,iVar14,iVar15 + 1,0);
    pOVar20 = (Op *)&sqlite3VdbeGetOp_dummy;
    if (p->db->mallocFailed == '\0') {
      iVar16 = p->nOp + -1;
      if (-1 < iVar15) {
        iVar16 = iVar15;
      }
      pOVar20 = p->aOp + iVar16;
    }
    pOVar20->p2 = p->nOp;
    sqlite3VdbeAddOp3(p,0x75,iVar14,0,0);
    sqlite3VdbeAddOp3(p,0x75,iCur,0,0);
    pIVar23 = pIVar23->pNext;
  } while( true );
LAB_001b9628:
  local_70 = local_70 + 1;
  if (local_70 == (uint)uVar4) goto LAB_001b9642;
  goto LAB_001b95e5;
}

Assistant:

static int xferOptimization(
  Parse *pParse,        /* Parser context */
  Table *pDest,         /* The table we are inserting into */
  Select *pSelect,      /* A SELECT statement to use as the data source */
  int onError,          /* How to handle constraint errors */
  int iDbDest           /* The database of pDest */
){
  sqlite3 *db = pParse->db;
  ExprList *pEList;                /* The result set of the SELECT */
  Table *pSrc;                     /* The table in the FROM clause of SELECT */
  Index *pSrcIdx, *pDestIdx;       /* Source and destination indices */
  struct SrcList_item *pItem;      /* An element of pSelect->pSrc */
  int i;                           /* Loop counter */
  int iDbSrc;                      /* The database of pSrc */
  int iSrc, iDest;                 /* Cursors from source and destination */
  int addr1, addr2;                /* Loop addresses */
  int emptyDestTest = 0;           /* Address of test for empty pDest */
  int emptySrcTest = 0;            /* Address of test for empty pSrc */
  Vdbe *v;                         /* The VDBE we are building */
  int regAutoinc;                  /* Memory register used by AUTOINC */
  int destHasUniqueIdx = 0;        /* True if pDest has a UNIQUE index */
  int regData, regRowid;           /* Registers holding data and rowid */

  if( pSelect==0 ){
    return 0;   /* Must be of the form  INSERT INTO ... SELECT ... */
  }
  if( pParse->pWith || pSelect->pWith ){
    /* Do not attempt to process this query if there are an WITH clauses
    ** attached to it. Proceeding may generate a false "no such table: xxx"
    ** error if pSelect reads from a CTE named "xxx".  */
    return 0;
  }
  if( sqlite3TriggerList(pParse, pDest) ){
    return 0;   /* tab1 must not have triggers */
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pDest) ){
    return 0;   /* tab1 must not be a virtual table */
  }
#endif
  if( onError==OE_Default ){
    if( pDest->iPKey>=0 ) onError = pDest->keyConf;
    if( onError==OE_Default ) onError = OE_Abort;
  }
  assert(pSelect->pSrc);   /* allocated even if there is no FROM clause */
  if( pSelect->pSrc->nSrc!=1 ){
    return 0;   /* FROM clause must have exactly one term */
  }
  if( pSelect->pSrc->a[0].pSelect ){
    return 0;   /* FROM clause cannot contain a subquery */
  }
  if( pSelect->pWhere ){
    return 0;   /* SELECT may not have a WHERE clause */
  }
  if( pSelect->pOrderBy ){
    return 0;   /* SELECT may not have an ORDER BY clause */
  }
  /* Do not need to test for a HAVING clause.  If HAVING is present but
  ** there is no ORDER BY, we will get an error. */
  if( pSelect->pGroupBy ){
    return 0;   /* SELECT may not have a GROUP BY clause */
  }
  if( pSelect->pLimit ){
    return 0;   /* SELECT may not have a LIMIT clause */
  }
  if( pSelect->pPrior ){
    return 0;   /* SELECT may not be a compound query */
  }
  if( pSelect->selFlags & SF_Distinct ){
    return 0;   /* SELECT may not be DISTINCT */
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );
  if( pEList->nExpr!=1 ){
    return 0;   /* The result set must have exactly one column */
  }
  assert( pEList->a[0].pExpr );
  if( pEList->a[0].pExpr->op!=TK_ASTERISK ){
    return 0;   /* The result set must be the special operator "*" */
  }

  /* At this point we have established that the statement is of the
  ** correct syntactic form to participate in this optimization.  Now
  ** we have to check the semantics.
  */
  pItem = pSelect->pSrc->a;
  pSrc = sqlite3LocateTableItem(pParse, 0, pItem);
  if( pSrc==0 ){
    return 0;   /* FROM clause does not contain a real table */
  }
  if( pSrc->tnum==pDest->tnum && pSrc->pSchema==pDest->pSchema ){
    testcase( pSrc!=pDest ); /* Possible due to bad sqlite_master.rootpage */
    return 0;   /* tab1 and tab2 may not be the same table */
  }
  if( HasRowid(pDest)!=HasRowid(pSrc) ){
    return 0;   /* source and destination must both be WITHOUT ROWID or not */
  }
#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( IsVirtual(pSrc) ){
    return 0;   /* tab2 must not be a virtual table */
  }
#endif
  if( pSrc->pSelect ){
    return 0;   /* tab2 may not be a view */
  }
  if( pDest->nCol!=pSrc->nCol ){
    return 0;   /* Number of columns must be the same in tab1 and tab2 */
  }
  if( pDest->iPKey!=pSrc->iPKey ){
    return 0;   /* Both tables must have the same INTEGER PRIMARY KEY */
  }
  for(i=0; i<pDest->nCol; i++){
    Column *pDestCol = &pDest->aCol[i];
    Column *pSrcCol = &pSrc->aCol[i];
#ifdef SQLITE_ENABLE_HIDDEN_COLUMNS
    if( (db->mDbFlags & DBFLAG_Vacuum)==0 
     && (pDestCol->colFlags | pSrcCol->colFlags) & COLFLAG_HIDDEN 
    ){
      return 0;    /* Neither table may have __hidden__ columns */
    }
#endif
    if( pDestCol->affinity!=pSrcCol->affinity ){
      return 0;    /* Affinity must be the same on all columns */
    }
    if( sqlite3_stricmp(pDestCol->zColl, pSrcCol->zColl)!=0 ){
      return 0;    /* Collating sequence must be the same on all columns */
    }
    if( pDestCol->notNull && !pSrcCol->notNull ){
      return 0;    /* tab2 must be NOT NULL if tab1 is */
    }
    /* Default values for second and subsequent columns need to match. */
    if( i>0 ){
      assert( pDestCol->pDflt==0 || pDestCol->pDflt->op==TK_SPAN );
      assert( pSrcCol->pDflt==0 || pSrcCol->pDflt->op==TK_SPAN );
      if( (pDestCol->pDflt==0)!=(pSrcCol->pDflt==0) 
       || (pDestCol->pDflt && strcmp(pDestCol->pDflt->u.zToken,
                                       pSrcCol->pDflt->u.zToken)!=0)
      ){
        return 0;    /* Default values must be the same for all columns */
      }
    }
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    if( IsUniqueIndex(pDestIdx) ){
      destHasUniqueIdx = 1;
    }
    for(pSrcIdx=pSrc->pIndex; pSrcIdx; pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    if( pSrcIdx==0 ){
      return 0;    /* pDestIdx has no corresponding index in pSrc */
    }
    if( pSrcIdx->tnum==pDestIdx->tnum && pSrc->pSchema==pDest->pSchema
         && sqlite3FaultSim(411)==SQLITE_OK ){
      /* The sqlite3FaultSim() call allows this corruption test to be
      ** bypassed during testing, in order to exercise other corruption tests
      ** further downstream. */
      return 0;   /* Corrupt schema - two indexes on the same btree */
    }
  }
#ifndef SQLITE_OMIT_CHECK
  if( pDest->pCheck && sqlite3ExprListCompare(pSrc->pCheck,pDest->pCheck,-1) ){
    return 0;   /* Tables have different CHECK constraints.  Ticket #2252 */
  }
#endif
#ifndef SQLITE_OMIT_FOREIGN_KEY
  /* Disallow the transfer optimization if the destination table constains
  ** any foreign key constraints.  This is more restrictive than necessary.
  ** But the main beneficiary of the transfer optimization is the VACUUM 
  ** command, and the VACUUM command disables foreign key constraints.  So
  ** the extra complication to make this rule less restrictive is probably
  ** not worth the effort.  Ticket [6284df89debdfa61db8073e062908af0c9b6118e]
  */
  if( (db->flags & SQLITE_ForeignKeys)!=0 && pDest->pFKey!=0 ){
    return 0;
  }
#endif
  if( (db->flags & SQLITE_CountRows)!=0 ){
    return 0;  /* xfer opt does not play well with PRAGMA count_changes */
  }

  /* If we get this far, it means that the xfer optimization is at
  ** least a possibility, though it might only work if the destination
  ** table (tab1) is initially empty.
  */
#ifdef SQLITE_TEST
  sqlite3_xferopt_count++;
#endif
  iDbSrc = sqlite3SchemaToIndex(db, pSrc->pSchema);
  v = sqlite3GetVdbe(pParse);
  sqlite3CodeVerifySchema(pParse, iDbSrc);
  iSrc = pParse->nTab++;
  iDest = pParse->nTab++;
  regAutoinc = autoIncBegin(pParse, iDbDest, pDest);
  regData = sqlite3GetTempReg(pParse);
  regRowid = sqlite3GetTempReg(pParse);
  sqlite3OpenTable(pParse, iDest, iDbDest, pDest, OP_OpenWrite);
  assert( HasRowid(pDest) || destHasUniqueIdx );
  if( (db->mDbFlags & DBFLAG_Vacuum)==0 && (
      (pDest->iPKey<0 && pDest->pIndex!=0)          /* (1) */
   || destHasUniqueIdx                              /* (2) */
   || (onError!=OE_Abort && onError!=OE_Rollback)   /* (3) */
  )){
    /* In some circumstances, we are able to run the xfer optimization
    ** only if the destination table is initially empty. Unless the
    ** DBFLAG_Vacuum flag is set, this block generates code to make
    ** that determination. If DBFLAG_Vacuum is set, then the destination
    ** table is always empty.
    **
    ** Conditions under which the destination must be empty:
    **
    ** (1) There is no INTEGER PRIMARY KEY but there are indices.
    **     (If the destination is not initially empty, the rowid fields
    **     of index entries might need to change.)
    **
    ** (2) The destination has a unique index.  (The xfer optimization 
    **     is unable to test uniqueness.)
    **
    ** (3) onError is something other than OE_Abort and OE_Rollback.
    */
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iDest, 0); VdbeCoverage(v);
    emptyDestTest = sqlite3VdbeAddOp0(v, OP_Goto);
    sqlite3VdbeJumpHere(v, addr1);
  }
  if( HasRowid(pSrc) ){
    u8 insFlags;
    sqlite3OpenTable(pParse, iSrc, iDbSrc, pSrc, OP_OpenRead);
    emptySrcTest = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    if( pDest->iPKey>=0 ){
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      sqlite3VdbeVerifyAbortable(v, onError);
      addr2 = sqlite3VdbeAddOp3(v, OP_NotExists, iDest, 0, regRowid);
      VdbeCoverage(v);
      sqlite3RowidConstraint(pParse, onError, pDest);
      sqlite3VdbeJumpHere(v, addr2);
      autoIncStep(pParse, regAutoinc, regRowid);
    }else if( pDest->pIndex==0 && !(db->mDbFlags & DBFLAG_VacuumInto) ){
      addr1 = sqlite3VdbeAddOp2(v, OP_NewRowid, iDest, regRowid);
    }else{
      addr1 = sqlite3VdbeAddOp2(v, OP_Rowid, iSrc, regRowid);
      assert( (pDest->tabFlags & TF_Autoincrement)==0 );
    }
    sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|
                           OPFLAG_APPEND|OPFLAG_USESEEKRESULT;
    }else{
      insFlags = OPFLAG_NCHANGE|OPFLAG_LASTROWID|OPFLAG_APPEND;
    }
    sqlite3VdbeAddOp4(v, OP_Insert, iDest, regData, regRowid,
                      (char*)pDest, P4_TABLE);
    sqlite3VdbeChangeP5(v, insFlags);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1); VdbeCoverage(v);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }else{
    sqlite3TableLock(pParse, iDbDest, pDest->tnum, 1, pDest->zName);
    sqlite3TableLock(pParse, iDbSrc, pSrc->tnum, 0, pSrc->zName);
  }
  for(pDestIdx=pDest->pIndex; pDestIdx; pDestIdx=pDestIdx->pNext){
    u8 idxInsFlags = 0;
    for(pSrcIdx=pSrc->pIndex; ALWAYS(pSrcIdx); pSrcIdx=pSrcIdx->pNext){
      if( xferCompatibleIndex(pDestIdx, pSrcIdx) ) break;
    }
    assert( pSrcIdx );
    sqlite3VdbeAddOp3(v, OP_OpenRead, iSrc, pSrcIdx->tnum, iDbSrc);
    sqlite3VdbeSetP4KeyInfo(pParse, pSrcIdx);
    VdbeComment((v, "%s", pSrcIdx->zName));
    sqlite3VdbeAddOp3(v, OP_OpenWrite, iDest, pDestIdx->tnum, iDbDest);
    sqlite3VdbeSetP4KeyInfo(pParse, pDestIdx);
    sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR);
    VdbeComment((v, "%s", pDestIdx->zName));
    addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iSrc, 0); VdbeCoverage(v);
    sqlite3VdbeAddOp3(v, OP_RowData, iSrc, regData, 1);
    if( db->mDbFlags & DBFLAG_Vacuum ){
      /* This INSERT command is part of a VACUUM operation, which guarantees
      ** that the destination table is empty. If all indexed columns use
      ** collation sequence BINARY, then it can also be assumed that the
      ** index will be populated by inserting keys in strictly sorted 
      ** order. In this case, instead of seeking within the b-tree as part
      ** of every OP_IdxInsert opcode, an OP_SeekEnd is added before the
      ** OP_IdxInsert to seek to the point within the b-tree where each key 
      ** should be inserted. This is faster.
      **
      ** If any of the indexed columns use a collation sequence other than
      ** BINARY, this optimization is disabled. This is because the user 
      ** might change the definition of a collation sequence and then run
      ** a VACUUM command. In that case keys may not be written in strictly
      ** sorted order.  */
      for(i=0; i<pSrcIdx->nColumn; i++){
        const char *zColl = pSrcIdx->azColl[i];
        if( sqlite3_stricmp(sqlite3StrBINARY, zColl) ) break;
      }
      if( i==pSrcIdx->nColumn ){
        idxInsFlags = OPFLAG_USESEEKRESULT;
        sqlite3VdbeAddOp1(v, OP_SeekEnd, iDest);
      }
    }
    if( !HasRowid(pSrc) && pDestIdx->idxType==SQLITE_IDXTYPE_PRIMARYKEY ){
      idxInsFlags |= OPFLAG_NCHANGE;
    }
    sqlite3VdbeAddOp2(v, OP_IdxInsert, iDest, regData);
    sqlite3VdbeChangeP5(v, idxInsFlags|OPFLAG_APPEND);
    sqlite3VdbeAddOp2(v, OP_Next, iSrc, addr1+1); VdbeCoverage(v);
    sqlite3VdbeJumpHere(v, addr1);
    sqlite3VdbeAddOp2(v, OP_Close, iSrc, 0);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
  }
  if( emptySrcTest ) sqlite3VdbeJumpHere(v, emptySrcTest);
  sqlite3ReleaseTempReg(pParse, regRowid);
  sqlite3ReleaseTempReg(pParse, regData);
  if( emptyDestTest ){
    sqlite3AutoincrementEnd(pParse);
    sqlite3VdbeAddOp2(v, OP_Halt, SQLITE_OK, 0);
    sqlite3VdbeJumpHere(v, emptyDestTest);
    sqlite3VdbeAddOp2(v, OP_Close, iDest, 0);
    return 0;
  }else{
    return 1;
  }
}